

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BorderagentGetLocator_Test::
~InterpreterTestSuite_PC_BorderagentGetLocator_Test
          (InterpreterTestSuite_PC_BorderagentGetLocator_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BorderagentGetLocator)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetBorderAgentLocator(_)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("borderagent get locator");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}